

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

void __thiscall
CMU462::Edge::getAxes(Edge *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  pointer pVVar5;
  Vector3D *v;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Vector3D local_38;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  p_Var1 = (this->_halfedge)._M_node;
  p_Var2 = p_Var1[1]._M_prev;
  p_Var3 = p_Var1[2]._M_prev;
  p_Var4 = p_Var2[2]._M_prev;
  dVar13 = (double)p_Var4[2]._M_prev - (double)p_Var3[2]._M_prev;
  pVVar5 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar10 = (double)p_Var4[1]._M_prev - (double)p_Var3[1]._M_prev;
  dVar11 = (double)p_Var4[2]._M_next - (double)p_Var3[2]._M_next;
  dVar12 = 1.0 / SQRT(dVar13 * dVar13 + dVar10 * dVar10 + dVar11 * dVar11);
  pVVar5->x = dVar12 * dVar10;
  pVVar5->y = dVar12 * dVar11;
  pVVar5->z = dVar13 * dVar12;
  p_Var2 = p_Var2[3]._M_prev;
  dVar13 = 0.0;
  dVar10 = 0.0;
  dVar11 = 0.0;
  if (*(char *)&p_Var1[3]._M_prev[0xc]._M_next == '\0') {
    Face::normal(&local_38,(Face *)(p_Var1[3]._M_prev + 1));
    dVar13 = (double)CONCAT44(local_38.x._4_4_,local_38.x._0_4_);
    dVar10 = (double)CONCAT44(local_38.y._4_4_,local_38.y._0_4_);
    dVar11 = local_38.z;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  dVar12 = 0.0;
  if (*(char *)&p_Var2[0xc]._M_next == '\0') {
    Face::normal(&local_38,(Face *)(p_Var2 + 1));
    uVar6 = local_38.x._0_4_;
    uVar7 = local_38.x._4_4_;
    uVar8 = local_38.y._0_4_;
    uVar9 = local_38.y._4_4_;
    dVar12 = local_38.z;
  }
  dVar11 = dVar11 + dVar12;
  dVar13 = dVar13 + (double)CONCAT44(uVar7,uVar6);
  dVar10 = dVar10 + (double)CONCAT44(uVar9,uVar8);
  dVar12 = 1.0 / SQRT(dVar11 * dVar11 + dVar13 * dVar13 + dVar10 * dVar10);
  v = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
      super__Vector_impl_data._M_start;
  v[2].x = dVar12 * dVar13;
  v[2].y = dVar12 * dVar10;
  v[2].z = dVar11 * dVar12;
  cross(v + 2,v);
  pVVar5 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar5[1].z = local_38.z;
  pVVar5[1].x = (double)CONCAT44(local_38.x._4_4_,local_38.x._0_4_);
  pVVar5[1].y = (double)CONCAT44(local_38.y._4_4_,local_38.y._0_4_);
  return;
}

Assistant:

void Edge::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the X direction to the edge direction, with
    // orientation determined by the first halfedge.
    Vector3D p0 = halfedge()->vertex()->position;
    Vector3D p1 = halfedge()->twin()->vertex()->position;
    axes[0] = ( p1 - p0 ).unit();

    // For the Z direction, use the average of the two
    // incident triangles---or if we have a boundary edge,
    // just use the normal of the single interior face.
    Vector3D N0( 0., 0., 0. );
    Vector3D N1( 0., 0., 0. );
    FaceCIter f0 = halfedge()->face();
    FaceCIter f1 = halfedge()->twin()->face();
    if( !f0->isBoundary() ) N0 = f0->normal();
    if( !f1->isBoundary() ) N1 = f1->normal();
    axes[2] = ( N0 + N1 ).unit();

    // Choose the Y direction so that X x Y = Z
    axes[1] = cross( axes[2], axes[0] );
  }